

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBar::paintEvent(QStatusBar *this,QPaintEvent *event)

{
  undefined8 uVar1;
  bool bVar2;
  Int IVar3;
  QStatusBarPrivate *this_00;
  QStyle *pQVar4;
  const_iterator o;
  QRect *pQVar5;
  ulong uVar6;
  QPalette *pQVar7;
  QPaintEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar8;
  SBItem *item;
  add_const_t<QList<QStatusBarPrivate::SBItem>_> *__range1;
  bool haveMessage;
  QStatusBarPrivate *d;
  QRect ir;
  const_iterator __end1;
  const_iterator __begin1;
  QPainter p;
  QStyleOption opt_1;
  QStyleOption opt;
  QStyleOption *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint version;
  QWidget *pQVar9;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QRect *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 local_b8;
  undefined8 local_b0;
  const_iterator local_98;
  undefined1 *local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 local_70;
  QPalette QStack_60;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = in_RDI;
  this_00 = d_func((QStatusBar *)0x6a4394);
  bVar2 = QString::isEmpty((QString *)0x6a43aa);
  version = (CONCAT13(bVar2,(int3)in_stack_ffffffffffffff14) ^ 0xff000000) & 0x1ffffff;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_90,&in_RDI->super_QPaintDevice);
  memset(local_48,0xaa,0x40);
  QStyleOption::QStyleOption((QStyleOption *)this_00,version,in_stack_ffffffffffffff10);
  QStyleOption::initFrom
            ((QStyleOption *)this_00,(QWidget *)CONCAT44(version,in_stack_ffffffffffffff10));
  pQVar4 = QWidget::style(in_RDI);
  (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,0x2e,local_48,&local_90,in_RDI);
  local_98.i = (SBItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = QList<QStatusBarPrivate::SBItem>::begin
                       ((QList<QStatusBarPrivate::SBItem> *)in_stack_ffffffffffffff00);
  o = QList<QStatusBarPrivate::SBItem>::end
                ((QList<QStatusBarPrivate::SBItem> *)in_stack_ffffffffffffff00);
  while (bVar2 = QList<QStatusBarPrivate::SBItem>::const_iterator::operator!=(&local_98,o), bVar2) {
    in_stack_ffffffffffffff00 =
         (QStyleOption *)QList<QStatusBarPrivate::SBItem>::const_iterator::operator*(&local_98);
    bVar2 = QWidget::isVisible((QWidget *)0x6a44d9);
    if ((bVar2) &&
       (((version & 0x1000000) == 0 ||
        (bVar2 = QStatusBarPrivate::SBItem::isPermanent((SBItem *)in_stack_ffffffffffffff00), bVar2)
        ))) {
      QWidget::geometry(*(QWidget **)in_stack_ffffffffffffff00);
      QVar8 = QRect::adjusted(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                              in_stack_ffffffffffffff30,(int)((ulong)pQVar9 >> 0x20),(int)pQVar9);
      pQVar5 = QPaintEvent::rect(in_RSI);
      uVar6 = QRect::intersects((QRect *)pQVar5);
      if ((uVar6 & 1) != 0) {
        memset(local_88,0xaa,0x40);
        QStyleOption::QStyleOption((QStyleOption *)this_00,version,in_stack_ffffffffffffff10);
        local_b8 = QVar8._0_8_;
        local_78 = local_b8;
        local_b0 = QVar8._8_8_;
        local_70 = local_b0;
        pQVar7 = QWidget::palette((QWidget *)in_stack_ffffffffffffff00);
        QPalette::operator=(&QStack_60,(QPalette *)pQVar7);
        QFlags<QStyle::StateFlag>::QFlags
                  ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff00,
                   (StateFlag)((ulong)in_RDI >> 0x20));
        pQVar4 = QWidget::style(in_RDI);
        uVar1._0_4_ = in_stack_ffffffffffffff00->version;
        uVar1._4_4_ = in_stack_ffffffffffffff00->type;
        (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,7,local_88,&local_90,uVar1);
        QStyleOption::~QStyleOption(in_stack_ffffffffffffff00);
      }
    }
    QList<QStatusBarPrivate::SBItem>::const_iterator::operator++(&local_98);
  }
  if ((version & 0x1000000) != 0) {
    QWidget::palette((QWidget *)in_stack_ffffffffffffff00);
    QPalette::windowText((QPalette *)0x6a4645);
    QBrush::color((QBrush *)0x6a464d);
    QPainter::setPen((QColor *)&local_90);
    QStatusBarPrivate::messageRect
              ((QStatusBarPrivate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                  (enum_type)in_stack_ffffffffffffff00);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff30);
    QPainter::drawText((QRect *)&local_90,(int)&stack0xffffffffffffff34,
                       (QString *)(ulong)(IVar3 | 0x100),(QRect *)&this_00->tempItem);
  }
  QStyleOption::~QStyleOption(in_stack_ffffffffffffff00);
  QPainter::~QPainter((QPainter *)&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStatusBar::paintEvent(QPaintEvent *event)
{
    Q_D(QStatusBar);
    bool haveMessage = !d->tempItem.isEmpty();

    QPainter p(this);
    QStyleOption opt;
    opt.initFrom(this);
    style()->drawPrimitive(QStyle::PE_PanelStatusBar, &opt, &p, this);

    for (const auto &item : std::as_const(d->items)) {
        if (item.widget->isVisible() && (!haveMessage || item.isPermanent())) {
            QRect ir = item.widget->geometry().adjusted(-2, -1, 2, 1);
            if (event->rect().intersects(ir)) {
                QStyleOption opt(0);
                opt.rect = ir;
                opt.palette = palette();
                opt.state = QStyle::State_None;
                style()->drawPrimitive(QStyle::PE_FrameStatusBarItem, &opt, &p, item.widget);
            }
        }
    }
    if (haveMessage) {
        p.setPen(palette().windowText().color());
        p.drawText(d->messageRect(), Qt::AlignLeading | Qt::AlignVCenter | Qt::TextSingleLine, d->tempItem);
    }
}